

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O0

void R_InitTranslationTables(void)

{
  byte bVar1;
  char cVar2;
  BYTE BVar3;
  uint32 uVar4;
  FRemapTablePtr *pFVar5;
  FRemapTable *pFVar6;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_44;
  int local_40;
  uint local_3c;
  int v;
  int b;
  int g;
  int r;
  FRemapTable *remap;
  BYTE IcePaletteRemap [16];
  int local_10;
  uint local_c;
  int j;
  int i;
  
  for (local_c = 0; (int)local_c < 8; local_c = local_c + 1) {
    PushIdentityTable(1);
    PushIdentityTable(2);
    PushIdentityTable(9);
  }
  PushIdentityTable(1);
  for (local_c = 0; (int)local_c < 8; local_c = local_c + 1) {
    PushIdentityTable(3);
  }
  for (local_c = 0; (int)local_c < 0x20; local_c = local_c + 1) {
    PushIdentityTable(6);
  }
  if ((gameinfo.gametype & GAME_DoomChex) == GAME_Any) {
    if (gameinfo.gametype == GAME_Heretic) {
      for (local_c = 0xe1; (int)local_c < 0xf1; local_c = local_c + 1) {
        cVar2 = (char)local_c;
        pFVar5 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                           (&translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>,0);
        pFVar6 = FRemapTablePtr::operator->(pFVar5);
        pFVar6->Remap[(int)local_c] = cVar2 + 0x91;
        pFVar5 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                           (&translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>,1);
        pFVar6 = FRemapTablePtr::operator->(pFVar5);
        pFVar6->Remap[(int)local_c] = cVar2 + 0xb0;
        pFVar5 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                           (&translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>,2);
        pFVar6 = FRemapTablePtr::operator->(pFVar5);
        pFVar6->Remap[(int)local_c] = cVar2 + 0xdd;
        uVar4 = PalEntry::operator_cast_to_unsigned_int
                          (GPalette.BaseColors + (int)(local_c + -0x6f));
        pFVar5 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                           (&translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>,0);
        pFVar6 = FRemapTablePtr::operator->(pFVar5);
        PalEntry::operator=(pFVar6->Palette + (int)local_c,uVar4 | 0xff000000);
        uVar4 = PalEntry::operator_cast_to_unsigned_int
                          (GPalette.BaseColors + (int)(local_c + -0x50));
        pFVar5 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                           (&translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>,1);
        pFVar6 = FRemapTablePtr::operator->(pFVar5);
        PalEntry::operator=(pFVar6->Palette + (int)local_c,uVar4 | 0xff000000);
        uVar4 = PalEntry::operator_cast_to_unsigned_int
                          (GPalette.BaseColors + (int)(local_c + -0x23));
        pFVar5 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                           (&translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>,2);
        pFVar6 = FRemapTablePtr::operator->(pFVar5);
        PalEntry::operator=(pFVar6->Palette + (int)local_c,uVar4 | 0xff000000);
      }
    }
    else if (gameinfo.gametype == GAME_Strife) {
      for (local_c = 0x20; (int)local_c < 0x40; local_c = local_c + 1) {
        bVar1 = (byte)local_c;
        pFVar5 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                           (&translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>,0);
        pFVar6 = FRemapTablePtr::operator->(pFVar5);
        pFVar6->Remap[(int)local_c] = bVar1 - 0x20;
        pFVar5 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                           (&translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>,1);
        pFVar6 = FRemapTablePtr::operator->(pFVar5);
        pFVar6->Remap[(int)local_c] = bVar1 - 0x20;
        pFVar5 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                           (&translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>,2);
        pFVar6 = FRemapTablePtr::operator->(pFVar5);
        pFVar6->Remap[(int)local_c] = (bVar1 & 0xf) - 0x30;
        pFVar5 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                           (&translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>,3);
        pFVar6 = FRemapTablePtr::operator->(pFVar5);
        pFVar6->Remap[(int)local_c] = (bVar1 & 0xf) - 0x30;
        pFVar5 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                           (&translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>,4);
        pFVar6 = FRemapTablePtr::operator->(pFVar5);
        pFVar6->Remap[(int)local_c] = bVar1 - 0x20;
        pFVar5 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                           (&translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>,5);
        pFVar6 = FRemapTablePtr::operator->(pFVar5);
        pFVar6->Remap[(int)local_c] = bVar1 - 0x20;
        pFVar5 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                           (&translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>,6);
        pFVar6 = FRemapTablePtr::operator->(pFVar5);
        pFVar6->Remap[(int)local_c] = bVar1 - 0x20;
      }
      for (local_c = 0x50; (int)local_c < 0x60; local_c = local_c + 1) {
        bVar1 = (byte)local_c;
        pFVar5 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                           (&translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>,4);
        pFVar6 = FRemapTablePtr::operator->(pFVar5);
        pFVar6->Remap[(int)local_c] = (bVar1 & 0xf) + 0x80;
        pFVar5 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                           (&translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>,5);
        pFVar6 = FRemapTablePtr::operator->(pFVar5);
        pFVar6->Remap[(int)local_c] = (bVar1 & 0xf) + 0x10;
        pFVar5 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                           (&translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>,6);
        pFVar6 = FRemapTablePtr::operator->(pFVar5);
        pFVar6->Remap[(int)local_c] = (bVar1 & 0xf) + 0x40;
      }
      for (local_c = 0x80; (int)local_c < 0x90; local_c = local_c + 1) {
        bVar1 = (byte)local_c;
        pFVar5 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                           (&translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>,0);
        pFVar6 = FRemapTablePtr::operator->(pFVar5);
        pFVar6->Remap[(int)local_c] = (bVar1 & 0xf) + 0x40;
        pFVar5 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                           (&translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>,1);
        pFVar6 = FRemapTablePtr::operator->(pFVar5);
        pFVar6->Remap[(int)local_c] = (bVar1 & 0xf) + 0xb0;
        pFVar5 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                           (&translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>,2);
        pFVar6 = FRemapTablePtr::operator->(pFVar5);
        pFVar6->Remap[(int)local_c] = (bVar1 & 0xf) + 0x10;
        pFVar5 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                           (&translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>,3);
        pFVar6 = FRemapTablePtr::operator->(pFVar5);
        pFVar6->Remap[(int)local_c] = (bVar1 & 0xf) + 0x30;
        pFVar5 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                           (&translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>,4);
        pFVar6 = FRemapTablePtr::operator->(pFVar5);
        pFVar6->Remap[(int)local_c] = (bVar1 & 0xf) + 0x50;
        pFVar5 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                           (&translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>,5);
        pFVar6 = FRemapTablePtr::operator->(pFVar5);
        pFVar6->Remap[(int)local_c] = (bVar1 & 0xf) + 0x60;
        pFVar5 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                           (&translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>,6);
        pFVar6 = FRemapTablePtr::operator->(pFVar5);
        pFVar6->Remap[(int)local_c] = (bVar1 & 0xf) + 0x90;
      }
      for (local_c = 0xc0; (int)local_c < 0xd0; local_c = local_c + 1) {
        bVar1 = (byte)local_c;
        pFVar5 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                           (&translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>,4);
        pFVar6 = FRemapTablePtr::operator->(pFVar5);
        pFVar6->Remap[(int)local_c] = (bVar1 & 0xf) + 0xa0;
        pFVar5 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                           (&translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>,5);
        pFVar6 = FRemapTablePtr::operator->(pFVar5);
        pFVar6->Remap[(int)local_c] = (bVar1 & 0xf) + 0x20;
        pFVar5 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                           (&translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>,6);
        pFVar6 = FRemapTablePtr::operator->(pFVar5);
        pFVar6->Remap[(int)local_c] = bVar1 & 0xf;
      }
      pFVar5 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                         (&translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>,6);
      pFVar6 = FRemapTablePtr::operator->(pFVar5);
      pFVar6->Remap[0xc0] = '\x01';
      for (local_c = 0xd0; (int)local_c < 0xe0; local_c = local_c + 1) {
        bVar1 = (byte)local_c;
        pFVar5 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                           (&translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>,4);
        pFVar6 = FRemapTablePtr::operator->(pFVar5);
        pFVar6->Remap[(int)local_c] = (bVar1 & 0xf) + 0xb0;
        pFVar5 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                           (&translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>,5);
        pFVar6 = FRemapTablePtr::operator->(pFVar5);
        pFVar6->Remap[(int)local_c] = (bVar1 & 0xf) + 0x30;
        pFVar5 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                           (&translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>,6);
        pFVar6 = FRemapTablePtr::operator->(pFVar5);
        pFVar6->Remap[(int)local_c] = (bVar1 & 0xf) + 0x10;
      }
      for (local_c = 0xf1; (int)local_c < 0xf7; local_c = local_c + 1) {
        pFVar5 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                           (&translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>,0);
        pFVar6 = FRemapTablePtr::operator->(pFVar5);
        pFVar6->Remap[(int)local_c] = ((byte)local_c & 0xf) - 0x21;
      }
      for (local_c = 0xf7; (int)local_c < 0xfc; local_c = local_c + 1) {
        pFVar5 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                           (&translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>,0);
        pFVar6 = FRemapTablePtr::operator->(pFVar5);
        pFVar6->Remap[(int)local_c] = (char)local_c + 0xfa;
      }
      for (local_c = 0; (int)local_c < 7; local_c = local_c + 1) {
        for (local_10 = 0x20; local_10 < 0xfc; local_10 = local_10 + 1) {
          pFVar5 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                             (&translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>,
                              (long)(int)local_c);
          pFVar6 = FRemapTablePtr::operator->(pFVar5);
          uVar4 = PalEntry::operator_cast_to_unsigned_int
                            (GPalette.BaseColors + pFVar6->Remap[local_10]);
          pFVar5 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                             (&translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>,
                              (long)(int)local_c);
          pFVar6 = FRemapTablePtr::operator->(pFVar5);
          PalEntry::operator=(pFVar6->Palette + local_10,uVar4 | 0xff000000);
        }
      }
    }
  }
  else {
    for (local_c = 0x70; (int)local_c < 0x80; local_c = local_c + 1) {
      bVar1 = (byte)local_c;
      pFVar5 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                         (&translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>,0);
      pFVar6 = FRemapTablePtr::operator->(pFVar5);
      pFVar6->Remap[(int)local_c] = (bVar1 & 0xf) + 0x60;
      pFVar5 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                         (&translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>,1);
      pFVar6 = FRemapTablePtr::operator->(pFVar5);
      pFVar6->Remap[(int)local_c] = (bVar1 & 0xf) + 0x40;
      pFVar5 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                         (&translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>,2);
      pFVar6 = FRemapTablePtr::operator->(pFVar5);
      pFVar6->Remap[(int)local_c] = (bVar1 & 0xf) + 0x20;
      uVar4 = PalEntry::operator_cast_to_unsigned_int
                        (GPalette.BaseColors + (int)((local_c & 0xf) + 0x60));
      pFVar5 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                         (&translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>,0);
      pFVar6 = FRemapTablePtr::operator->(pFVar5);
      PalEntry::operator=(pFVar6->Palette + (int)local_c,uVar4 | 0xff000000);
      uVar4 = PalEntry::operator_cast_to_unsigned_int
                        (GPalette.BaseColors + (int)((local_c & 0xf) + 0x40));
      pFVar5 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                         (&translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>,1);
      pFVar6 = FRemapTablePtr::operator->(pFVar5);
      PalEntry::operator=(pFVar6->Palette + (int)local_c,uVar4 | 0xff000000);
      uVar4 = PalEntry::operator_cast_to_unsigned_int
                        (GPalette.BaseColors + (int)((local_c & 0xf) + 0x20));
      pFVar5 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                         (&translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>,2);
      pFVar6 = FRemapTablePtr::operator->(pFVar5);
      PalEntry::operator=(pFVar6->Palette + (int)local_c,uVar4 | 0xff000000);
    }
  }
  for (local_c = 0; (int)local_c < 0x10; local_c = local_c + 1) {
    BVar3 = FColorMatcher::Pick(&ColorMatcher,(uint)IcePalette[(int)local_c][0],
                                (uint)IcePalette[(int)local_c][1],(uint)IcePalette[(int)local_c][2])
    ;
    IcePaletteRemap[(long)(int)local_c + -8] = BVar3;
  }
  pFVar5 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                     (&translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>,7);
  _g = FRemapTablePtr::operator_cast_to_FRemapTable_(pFVar5);
  for (local_c = 0; (int)local_c < 0x100; local_c = local_c + 1) {
    b = (int)GPalette.BaseColors[(int)local_c].field_0.field_0.r;
    v = (int)GPalette.BaseColors[(int)local_c].field_0.field_0.g;
    local_3c = (uint)GPalette.BaseColors[(int)local_c].field_0.field_0.b;
    local_40 = (int)(b * 0x4d + v * 0x8f + local_3c * 0x25) >> 0xc;
    _g->Remap[(int)local_c] = IcePaletteRemap[(long)local_40 + -8];
    PalEntry::PalEntry((PalEntry *)&local_44.field_0,0xff,IcePalette[local_40][0],
                       IcePalette[local_40][1],IcePalette[local_40][2]);
    _g->Palette[(int)local_c].field_0 = local_44;
  }
  return;
}

Assistant:

void R_InitTranslationTables ()
{
	int i;

	// Each player gets two translations. Doom and Strife don't use the
	// extra ones, but Heretic and Hexen do. These are set up during
	// netgame arbitration and as-needed, so they just get to be identity
	// maps until then so they won't be invalid.
	for (i = 0; i < MAXPLAYERS; ++i)
	{
		PushIdentityTable(TRANSLATION_Players);
		PushIdentityTable(TRANSLATION_PlayersExtra);
		PushIdentityTable(TRANSLATION_RainPillar);
	}
	// The menu player also gets a separate translation table
	PushIdentityTable(TRANSLATION_Players);

	// The three standard translations from Doom or Heretic (seven for Strife),
	// plus the generic ice translation.
	for (i = 0; i < 8; ++i)
	{
		PushIdentityTable(TRANSLATION_Standard);
	}

	// Each player corpse has its own translation so they won't change
	// color if the player who created them changes theirs.
	for (i = 0; i < BODYQUESIZE; ++i)
	{
		PushIdentityTable(TRANSLATION_PlayerCorpses);
	}

	// Create the standard translation tables
	if (gameinfo.gametype & GAME_DoomChex)
	{
		for (i = 0x70; i < 0x80; i++)
		{ // map green ramp to gray, brown, red
			translationtables[TRANSLATION_Standard][0]->Remap[i] = 0x60 + (i&0xf);
			translationtables[TRANSLATION_Standard][1]->Remap[i] = 0x40 + (i&0xf);
			translationtables[TRANSLATION_Standard][2]->Remap[i] = 0x20 + (i&0xf);

			translationtables[TRANSLATION_Standard][0]->Palette[i] = GPalette.BaseColors[0x60 + (i&0xf)] | MAKEARGB(255,0,0,0);
			translationtables[TRANSLATION_Standard][1]->Palette[i] = GPalette.BaseColors[0x40 + (i&0xf)] | MAKEARGB(255,0,0,0);
			translationtables[TRANSLATION_Standard][2]->Palette[i] = GPalette.BaseColors[0x20 + (i&0xf)] | MAKEARGB(255,0,0,0);
		}
	}
	else if (gameinfo.gametype == GAME_Heretic)
	{
		for (i = 225; i <= 240; i++)
		{
			translationtables[TRANSLATION_Standard][0]->Remap[i] = 114+(i-225); // yellow
			translationtables[TRANSLATION_Standard][1]->Remap[i] = 145+(i-225); // red
			translationtables[TRANSLATION_Standard][2]->Remap[i] = 190+(i-225); // blue
			
			translationtables[TRANSLATION_Standard][0]->Palette[i] = GPalette.BaseColors[114+(i-225)] | MAKEARGB(255,0,0,0);
			translationtables[TRANSLATION_Standard][1]->Palette[i] = GPalette.BaseColors[145+(i-225)] | MAKEARGB(255,0,0,0);
			translationtables[TRANSLATION_Standard][2]->Palette[i] = GPalette.BaseColors[190+(i-225)] | MAKEARGB(255,0,0,0);
		}
	}
	else if (gameinfo.gametype == GAME_Strife)
	{
		for (i = 0x20; i <= 0x3F; ++i)
		{
			translationtables[TRANSLATION_Standard][0]->Remap[i] = i - 0x20;
			translationtables[TRANSLATION_Standard][1]->Remap[i] = i - 0x20;
			translationtables[TRANSLATION_Standard][2]->Remap[i] = 0xD0 + (i&0xf);
			translationtables[TRANSLATION_Standard][3]->Remap[i] = 0xD0 + (i&0xf);
			translationtables[TRANSLATION_Standard][4]->Remap[i] = i - 0x20;
			translationtables[TRANSLATION_Standard][5]->Remap[i] = i - 0x20;
			translationtables[TRANSLATION_Standard][6]->Remap[i] = i - 0x20;
		}
		for (i = 0x50; i <= 0x5F; ++i)
		{
			// Merchant hair
			translationtables[TRANSLATION_Standard][4]->Remap[i] = 0x80 + (i&0xf);
			translationtables[TRANSLATION_Standard][5]->Remap[i] = 0x10 + (i&0xf);
			translationtables[TRANSLATION_Standard][6]->Remap[i] = 0x40 + (i&0xf);
		}
		for (i = 0x80; i <= 0x8F; ++i)
		{
			translationtables[TRANSLATION_Standard][0]->Remap[i] = 0x40 + (i&0xf); // red
			translationtables[TRANSLATION_Standard][1]->Remap[i] = 0xB0 + (i&0xf); // rust
			translationtables[TRANSLATION_Standard][2]->Remap[i] = 0x10 + (i&0xf); // gray
			translationtables[TRANSLATION_Standard][3]->Remap[i] = 0x30 + (i&0xf); // dark green
			translationtables[TRANSLATION_Standard][4]->Remap[i] = 0x50 + (i&0xf); // gold
			translationtables[TRANSLATION_Standard][5]->Remap[i] = 0x60 + (i&0xf); // bright green
			translationtables[TRANSLATION_Standard][6]->Remap[i] = 0x90 + (i&0xf); // blue
		}
		for (i = 0xC0; i <= 0xCF; ++i)
		{
			translationtables[TRANSLATION_Standard][4]->Remap[i] = 0xA0 + (i&0xf);
			translationtables[TRANSLATION_Standard][5]->Remap[i] = 0x20 + (i&0xf);
			translationtables[TRANSLATION_Standard][6]->Remap[i] = (i&0xf);
		}
		translationtables[TRANSLATION_Standard][6]->Remap[0xC0] = 1;
		for (i = 0xD0; i <= 0xDF; ++i)
		{
			translationtables[TRANSLATION_Standard][4]->Remap[i] = 0xB0 + (i&0xf);
			translationtables[TRANSLATION_Standard][5]->Remap[i] = 0x30 + (i&0xf);
			translationtables[TRANSLATION_Standard][6]->Remap[i] = 0x10 + (i&0xf);
		}
		for (i = 0xF1; i <= 0xF6; ++i)
		{
			translationtables[TRANSLATION_Standard][0]->Remap[i] = 0xDF + (i&0xf);
		}
		for (i = 0xF7; i <= 0xFB; ++i)
		{
			translationtables[TRANSLATION_Standard][0]->Remap[i] = i - 6;
		}
		for (i = 0; i < 7; ++i)
		{
			for (int j = 0x20; j <= 0xFB; ++j)
			{
				translationtables[TRANSLATION_Standard][i]->Palette[j] =
					GPalette.BaseColors[translationtables[TRANSLATION_Standard][i]->Remap[j]] | MAKEARGB(255,0,0,0);
			}
		}
	}

	// Create the ice translation table, based on Hexen's. Alas, the standard
	// Doom palette has no good substitutes for these bluish-tinted grays, so
	// they will just look gray unless you use a different PLAYPAL with Doom.

	BYTE IcePaletteRemap[16];
	for (i = 0; i < 16; ++i)
	{
		IcePaletteRemap[i] = ColorMatcher.Pick (IcePalette[i][0], IcePalette[i][1], IcePalette[i][2]);
	}
	FRemapTable *remap = translationtables[TRANSLATION_Standard][7];
	for (i = 0; i < 256; ++i)
	{
		int r = GPalette.BaseColors[i].r;
		int g = GPalette.BaseColors[i].g;
		int b = GPalette.BaseColors[i].b;
		int v = (r*77 + g*143 + b*37) >> 12;
		remap->Remap[i] = IcePaletteRemap[v];
		remap->Palette[i] = PalEntry(255, IcePalette[v][0], IcePalette[v][1], IcePalette[v][2]);
	}
}